

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::Truncate(RepeatedField<float> *this,int new_size)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = this->current_size_;
  if (iVar1 < new_size) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x649);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    iVar1 = this->current_size_;
  }
  if (0 < iVar1) {
    this->current_size_ = new_size;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  GOOGLE_DCHECK_LE(new_size, current_size_);
  if (current_size_ > 0) {
    current_size_ = new_size;
  }
}